

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.cpp
# Opt level: O3

compressed_lower_distance_matrix *
read_dipha(compressed_lower_distance_matrix *__return_storage_ptr__,istream *input_stream)

{
  uint uVar1;
  compressed_lower_distance_matrix *pcVar2;
  ostream *poVar3;
  uint uVar4;
  char *pcVar5;
  int j;
  uint uVar6;
  vector<float,_std::allocator<float>_> distances;
  double result_3;
  vector<float,_std::allocator<float>_> local_68;
  float local_44;
  compressed_lower_distance_matrix *local_40;
  double local_38;
  
  std::istream::read((char *)input_stream,(long)&local_68);
  if (local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start == (pointer)0x1e0d74600) {
    local_40 = __return_storage_ptr__;
    std::istream::read((char *)input_stream,(long)&local_68);
    if (local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start == (pointer)0x7) {
      std::istream::read((char *)input_stream,(long)&local_68);
      uVar1 = (uint)local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start;
      local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (float *)0x0;
      local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (float *)0x0;
      if (0 < (int)uVar1) {
        uVar4 = 0;
        do {
          uVar6 = 0;
          do {
            if (uVar6 < uVar4) {
              std::istream::read((char *)input_stream,(long)&local_38);
              local_44 = (float)local_38;
              if (local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                          (&local_68,
                           (iterator)
                           local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_finish,&local_44);
              }
              else {
                *local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish = local_44;
                local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
            }
            else {
              std::istream::read((char *)input_stream,(long)&local_38);
            }
            uVar6 = uVar6 + 1;
          } while (uVar1 != uVar6);
          uVar4 = uVar4 + 1;
        } while (uVar4 != uVar1);
      }
      pcVar2 = local_40;
      compressed_distance_matrix<(compressed_matrix_layout)0>::compressed_distance_matrix
                (local_40,&local_68);
      if (local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start != (pointer)0x0) {
        operator_delete(local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      return pcVar2;
    }
    pcVar5 = "input is not a Dipha distance matrix (file type: 7)";
  }
  else {
    pcVar5 = "input is not a Dipha file (magic number: 8067171840)";
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,pcVar5);
  std::endl<char,std::char_traits<char>>(poVar3);
  exit(-1);
}

Assistant:

compressed_lower_distance_matrix read_dipha(std::istream& input_stream) {
	if (read<int64_t>(input_stream) != 8067171840) {
		std::cerr << "input is not a Dipha file (magic number: 8067171840)" << std::endl;
		exit(-1);
	}

	if (read<int64_t>(input_stream) != 7) {
		std::cerr << "input is not a Dipha distance matrix (file type: 7)" << std::endl;
		exit(-1);
	}

	index_t n = index_t(read<int64_t>(input_stream));

	std::vector<value_t> distances;

	for (int i = 0; i < n; ++i)
		for (int j = 0; j < n; ++j)
			if (i > j)
				distances.push_back(value_t(read<double>(input_stream)));
			else
				read<double>(input_stream);

	return compressed_lower_distance_matrix(std::move(distances));
}